

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O0

int __thiscall VVCStreamReader::intDecodeNAL(VVCStreamReader *this,uint8_t *buff)

{
  bool bVar1;
  bool bVar2;
  NalType nalType_00;
  int iVar3;
  VvcSpsUnit *this_00;
  VvcPpsUnit *this_01;
  uint8_t *local_88;
  uint8_t *local_80;
  uint8_t *nextNalWithStartCode;
  uint8_t *puStack_40;
  NalType nalType;
  uint8_t *nextNal;
  uint8_t *curPos;
  uint8_t *prevPos;
  bool sliceFound;
  int rez;
  uint8_t *buff_local;
  VVCStreamReader *this_local;
  
  bVar1 = false;
  (this->super_MPEGStreamReader).m_spsPpsFound = false;
  this->m_lastIFrame = false;
  curPos = (uint8_t *)0x0;
  puStack_40 = NALUnit::findNextNAL
                         (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  nextNal = buff;
  if ((((this->super_MPEGStreamReader).m_eof & 1U) != 0) ||
     (puStack_40 != (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd)) {
    do {
      if ((this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd <= nextNal) {
        if (((this->super_MPEGStreamReader).m_eof & 1U) == 0) {
          return 1;
        }
        (this->super_MPEGStreamReader).m_lastDecodedPos =
             (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
        return 0;
      }
      nalType_00 = (int)(uint)*nextNal >> 1 & 0x3f;
      bVar2 = isSlice(this,nalType_00);
      if (bVar2) {
        if ((nextNal[2] & 0x80) != 0) {
          if (bVar1) {
            (this->super_MPEGStreamReader).m_lastDecodedPos = curPos;
            incTimings(this);
            return 0;
          }
          if (puStack_40 < nextNal + 0x40) {
            local_80 = puStack_40;
          }
          else {
            local_80 = nextNal + 0x40;
          }
          VvcUnit::decodeBuffer(&this->m_slice->super_VvcUnit,nextNal,local_80);
          iVar3 = VvcSliceHeader::deserialize(this->m_slice,this->m_sps,this->m_pps);
          if (iVar3 != 0) {
            return iVar3;
          }
          if (6 < nalType_00) {
            this->m_lastIFrame = true;
          }
          iVar3 = toFullPicOrder(this,this->m_slice,(uint)this->m_sps->log2_max_pic_order_cnt_lsb);
          this->m_fullPicOrder = iVar3;
        }
        bVar1 = true;
      }
      else {
        bVar2 = isSuffix(this,nalType_00);
        if (!bVar2) {
          if (bVar1) {
            incTimings(this);
            (this->super_MPEGStreamReader).m_lastDecodedPos = curPos;
            return 0;
          }
          if (puStack_40[-4] == '\0') {
            local_88 = puStack_40 + -4;
          }
          else {
            local_88 = puStack_40 + -3;
          }
          if (nalType_00 == VPS) {
            VvcUnit::decodeBuffer((VvcUnit *)this->m_vps,nextNal,local_88);
            iVar3 = VvcVpsUnit::deserialize(this->m_vps);
            if (iVar3 != 0) {
              return iVar3;
            }
            (this->super_MPEGStreamReader).m_spsPpsFound = true;
            this->m_vpsCounter = this->m_vpsCounter + 1;
            this->m_vpsSizeDiff = 0;
            if (this->m_vps->num_units_in_tick != 0) {
              MPEGStreamReader::updateFPS
                        (&this->super_MPEGStreamReader,this->m_vps,nextNal,local_88,0);
            }
            puStack_40 = puStack_40 + this->m_vpsSizeDiff;
            storeBuffer(&this->m_vpsBuffer,nextNal,local_88);
          }
          else if (nalType_00 == SPS) {
            if (this->m_sps == (VvcSpsUnit *)0x0) {
              this_00 = (VvcSpsUnit *)operator_new(0xa8);
              VvcSpsUnit::VvcSpsUnit(this_00);
              this->m_sps = this_00;
            }
            VvcUnit::decodeBuffer((VvcUnit *)this->m_sps,nextNal,local_88);
            iVar3 = VvcSpsUnit::deserialize(this->m_sps);
            if (iVar3 != 0) {
              return iVar3;
            }
            (this->super_MPEGStreamReader).m_spsPpsFound = true;
            MPEGStreamReader::updateFPS
                      (&this->super_MPEGStreamReader,this->m_sps,nextNal,local_88,0);
            storeBuffer(&this->m_spsBuffer,nextNal,local_88);
          }
          else if (nalType_00 == PPS) {
            if (this->m_pps == (VvcPpsUnit *)0x0) {
              this_01 = (VvcPpsUnit *)operator_new(0x40);
              VvcPpsUnit::VvcPpsUnit(this_01);
              this->m_pps = this_01;
            }
            VvcUnit::decodeBuffer(&this->m_pps->super_VvcUnit,nextNal,local_88);
            iVar3 = VvcPpsUnit::deserialize(this->m_pps);
            if (iVar3 != 0) {
              return iVar3;
            }
            (this->super_MPEGStreamReader).m_spsPpsFound = true;
            storeBuffer(&this->m_ppsBuffer,nextNal,local_88);
          }
        }
      }
      curPos = nextNal;
      nextNal = puStack_40;
      puStack_40 = NALUnit::findNextNAL
                             (puStack_40,
                              (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
    } while ((((this->super_MPEGStreamReader).m_eof & 1U) != 0) ||
            (puStack_40 != (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd));
  }
  return -10;
}

Assistant:

int VVCStreamReader::intDecodeNAL(uint8_t* buff)
{
    int rez;
    bool sliceFound = false;
    m_spsPpsFound = false;
    m_lastIFrame = false;

    const uint8_t* prevPos = nullptr;
    uint8_t* curPos = buff;
    uint8_t* nextNal = NALUnit::findNextNAL(curPos, m_bufEnd);

    if (!m_eof && nextNal == m_bufEnd)
        return NOT_ENOUGH_BUFFER;

    while (curPos < m_bufEnd)
    {
        const auto nalType = static_cast<VvcUnit::NalType>((*curPos >> 1) & 0x3f);
        if (isSlice(nalType))
        {
            if (curPos[2] & 0x80)  // slice.first_slice
            {
                if (sliceFound)
                {  // first slice of next frame: case where there is no non-VCL NAL between the two frames
                    m_lastDecodedPos = prevPos;  // next frame started
                    incTimings();
                    return 0;
                }
                // first slice of current frame
                m_slice->decodeBuffer(curPos, FFMIN(curPos + MAX_SLICE_HEADER, nextNal));
                rez = m_slice->deserialize(m_sps, m_pps);
                if (rez)
                    return rez;  // not enough buffer or error
                if (nalType >= VvcUnit::NalType::IDR_W_RADL)
                    m_lastIFrame = true;
                m_fullPicOrder = toFullPicOrder(m_slice, m_sps->log2_max_pic_order_cnt_lsb);
            }
            sliceFound = true;
        }
        else if (!isSuffix(nalType))
        {  // first non-VCL prefix NAL (AUD, SEI...) following current frame
            if (sliceFound)
            {
                incTimings();
                m_lastDecodedPos = prevPos;  // next frame started
                return 0;
            }

            uint8_t* nextNalWithStartCode = nextNal[-4] == 0 ? nextNal - 4 : nextNal - 3;

            switch (nalType)
            {
            case VvcUnit::NalType::VPS:
                m_vps->decodeBuffer(curPos, nextNalWithStartCode);
                rez = m_vps->deserialize();
                if (rez)
                    return rez;
                m_spsPpsFound = true;
                m_vpsCounter++;
                m_vpsSizeDiff = 0;
                if (m_vps->num_units_in_tick)
                    updateFPS(m_vps, curPos, nextNalWithStartCode, 0);
                nextNal += m_vpsSizeDiff;
                storeBuffer(m_vpsBuffer, curPos, nextNalWithStartCode);
                break;
            case VvcUnit::NalType::SPS:
                if (!m_sps)
                    m_sps = new VvcSpsUnit();
                m_sps->decodeBuffer(curPos, nextNalWithStartCode);
                rez = m_sps->deserialize();
                if (rez)
                    return rez;
                m_spsPpsFound = true;
                updateFPS(m_sps, curPos, nextNalWithStartCode, 0);
                storeBuffer(m_spsBuffer, curPos, nextNalWithStartCode);
                break;
            case VvcUnit::NalType::PPS:
                if (!m_pps)
                    m_pps = new VvcPpsUnit();
                m_pps->decodeBuffer(curPos, nextNalWithStartCode);
                rez = m_pps->deserialize();
                if (rez)
                    return rez;
                m_spsPpsFound = true;
                storeBuffer(m_ppsBuffer, curPos, nextNalWithStartCode);
                break;
            default:
                break;
            }
        }
        prevPos = curPos;
        curPos = nextNal;
        nextNal = NALUnit::findNextNAL(curPos, m_bufEnd);

        if (!m_eof && nextNal == m_bufEnd)
            return NOT_ENOUGH_BUFFER;
    }
    if (m_eof)
    {
        m_lastDecodedPos = m_bufEnd;
        return 0;
    }
    return NEED_MORE_DATA;
}